

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_write.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  int iVar2;
  FILE *__stream;
  long lVar3;
  sockaddr_in sin;
  char mem [102400];
  sockaddr asStack_19028 [6401];
  
  if ((1 < argc) && (inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((password = argv[3], argc != 4 && (loclfile = argv[4], 5 < (uint)argc)))) {
      sftppath = argv[5];
    }
  }
  uVar1 = libssh2_init(0);
  if (uVar1 == 0) {
    __stream = fopen(loclfile,"rb");
    if (__stream != (FILE *)0x0) {
      __fd = socket(2,1,0);
      if (__fd == -1) {
        main_cold_4();
      }
      else {
        iVar2 = connect(__fd,asStack_19028,0x10);
        if (iVar2 == 0) {
          lVar3 = libssh2_session_init_ex(0,0,0,0);
          if (lVar3 == 0) {
            main_cold_3();
          }
          else {
            libssh2_session_set_blocking(lVar3,1);
            uVar1 = libssh2_session_handshake(lVar3,__fd);
            if (uVar1 == 0) {
              main_cold_2();
            }
            else {
              fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar1);
            }
            libssh2_session_disconnect_ex(lVar3,0xb,"Normal Shutdown","");
            libssh2_session_free(lVar3);
          }
        }
        else {
          main_cold_1();
        }
        shutdown(__fd,2);
        close(__fd);
      }
      fclose(__stream);
      fwrite("all done\n",9,1,_stderr);
      libssh2_exit();
      return 0;
    }
    main_cold_5();
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    ssize_t nwritten;
    char *ptr;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        sftppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open()!\n");
    /* Request a file via SFTP */
    sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                    LIBSSH2_FXF_WRITE |
                                    LIBSSH2_FXF_CREAT |
                                    LIBSSH2_FXF_TRUNC,
                                    LIBSSH2_SFTP_S_IRUSR |
                                    LIBSSH2_SFTP_S_IWUSR |
                                    LIBSSH2_SFTP_S_IRGRP |
                                    LIBSSH2_SFTP_S_IROTH);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() is done, now send data!\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            /* write data in a loop until we block */
            nwritten = libssh2_sftp_write(sftp_handle, ptr, nread);
            if(nwritten < 0)
                break;
            ptr += nwritten;
            nread -= nwritten;
        } while(nread);
    } while(nwritten > 0);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}